

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void aom_int_pro_col_c(int16_t *vbuf,uint8_t *ref,int ref_stride,int width,int height,
                      int norm_factor)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  short sVar5;
  
  uVar4 = 0;
  uVar1 = (ulong)(uint)width;
  if (width < 1) {
    uVar1 = uVar4;
  }
  uVar3 = (ulong)(uint)height;
  if (height < 1) {
    uVar3 = uVar4;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    sVar5 = 0;
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      sVar5 = sVar5 + (ushort)ref[uVar2];
    }
    vbuf[uVar4] = (int16_t)((int)sVar5 >> ((byte)norm_factor & 0x1f));
    ref = ref + ref_stride;
  }
  return;
}

Assistant:

void aom_int_pro_col_c(int16_t *vbuf, const uint8_t *ref, const int ref_stride,
                       const int width, const int height, int norm_factor) {
  for (int ht = 0; ht < height; ++ht) {
    int16_t sum = 0;
    // sum: 14 bit, dynamic range [0, 32640]
    for (int idx = 0; idx < width; ++idx) sum += ref[idx];
    vbuf[ht] = sum >> norm_factor;
    ref += ref_stride;
  }
}